

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# generated_message_reflection.cc
# Opt level: O0

void google::protobuf::internal::RegisterFileLevelMetadata(DescriptorTable *table)

{
  undefined8 in_RDI;
  int size;
  
  size = (int)((ulong)in_RDI >> 0x20);
  AssignDescriptors((DescriptorTable *)0x424dce);
  RegisterAllTypesInternal((Metadata *)table,size);
  return;
}

Assistant:

void RegisterFileLevelMetadata(const DescriptorTable* table) {
  AssignDescriptors(table);
  RegisterAllTypesInternal(table->file_level_metadata, table->num_messages);
}